

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::PlotBarsEx<ImPlot::GetterBarV<long_long>>
               (char *label_id,GetterBarV<long_long> *getter,double width)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  longlong *plVar7;
  ImPlotPlot *pIVar8;
  long lVar9;
  ImPlotContext *pIVar10;
  bool bVar11;
  ImU32 col;
  ImU32 col_00;
  ImDrawList *this;
  int iVar12;
  int iVar13;
  int iVar14;
  ImPlotRange *pIVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  ImVec2 b;
  ImVec2 a;
  byte local_44;
  ImVec2 local_40;
  ImVec2 local_38;
  
  bVar11 = BeginItem(label_id,1);
  pIVar10 = GImPlot;
  if (bVar11) {
    dVar22 = width * 0.5;
    if ((GImPlot->FitThisFrame == true) && (iVar12 = getter->Count, 0 < iVar12)) {
      dVar16 = getter->XShift;
      plVar7 = getter->Ys;
      iVar14 = getter->Offset;
      iVar3 = getter->Stride;
      pIVar8 = GImPlot->CurrentPlot;
      iVar4 = pIVar8->CurrentYAxis;
      uVar5 = (pIVar8->XAxis).Flags;
      pIVar15 = GImPlot->ExtentsY + iVar4;
      uVar6 = pIVar8->YAxis[iVar4].Flags;
      iVar13 = 0;
      dVar17 = 0.0;
      do {
        lVar9 = *(long *)((long)plVar7 +
                         (long)(((iVar14 + iVar13) % iVar12 + iVar12) % iVar12) * (long)iVar3);
        dVar19 = (double)lVar9;
        dVar18 = dVar16 + dVar17;
        dVar20 = dVar18 - dVar22;
        if ((uVar5 >> 10 & 1) == 0) {
          if ((long)ABS(dVar20) < 0x7ff0000000000000) {
LAB_001f507d:
            if ((0.0 < dVar20) || ((uVar5 & 0x20) == 0)) {
              dVar1 = (pIVar10->ExtentsX).Min;
              dVar21 = dVar20;
              if (dVar1 <= dVar20) {
                dVar21 = dVar1;
              }
              (pIVar10->ExtentsX).Min = dVar21;
              dVar1 = (pIVar10->ExtentsX).Max;
              dVar21 = dVar20;
              if (dVar20 <= dVar1) {
                dVar21 = dVar1;
              }
              (pIVar10->ExtentsX).Max = dVar21;
            }
          }
        }
        else if ((((long)ABS(dVar20) < 0x7ff0000000000000) &&
                 (pIVar8->YAxis[iVar4].Range.Min <= dVar19)) &&
                (dVar19 <= pIVar8->YAxis[iVar4].Range.Max)) goto LAB_001f507d;
        if ((uVar6 >> 10 & 1) == 0) {
          if ((0 < lVar9) || ((uVar6 & 0x20) == 0)) {
LAB_001f50e7:
            dVar20 = dVar19;
            if (pIVar15->Min <= dVar19) {
              dVar20 = pIVar15->Min;
            }
            pIVar15->Min = dVar20;
            dVar20 = pIVar10->ExtentsY[iVar4].Max;
            if (dVar19 <= dVar20) {
              dVar19 = dVar20;
            }
            pIVar10->ExtentsY[iVar4].Max = dVar19;
          }
        }
        else if ((((pIVar8->XAxis).Range.Min <= dVar20) && (dVar20 <= (pIVar8->XAxis).Range.Max)) &&
                (local_44 = (byte)((uVar6 & 0x20) >> 5), (lVar9 < 1 & local_44) == 0))
        goto LAB_001f50e7;
        dVar18 = dVar18 + dVar22;
        if ((uVar5 >> 10 & 1) == 0) {
          if ((long)ABS(dVar18) < 0x7ff0000000000000) {
LAB_001f513c:
            if ((0.0 < dVar18) || ((uVar5 & 0x20) == 0)) {
              dVar19 = (pIVar10->ExtentsX).Min;
              dVar20 = dVar18;
              if (dVar19 <= dVar18) {
                dVar20 = dVar19;
              }
              (pIVar10->ExtentsX).Min = dVar20;
              dVar19 = (pIVar10->ExtentsX).Max;
              dVar20 = dVar18;
              if (dVar18 <= dVar19) {
                dVar20 = dVar19;
              }
              (pIVar10->ExtentsX).Max = dVar20;
            }
          }
        }
        else if ((((long)ABS(dVar18) < 0x7ff0000000000000) &&
                 (pIVar8->YAxis[iVar4].Range.Min <= 0.0)) && (0.0 <= pIVar8->YAxis[iVar4].Range.Max)
                ) goto LAB_001f513c;
        if ((uVar6 >> 10 & 1) == 0) {
          if ((uVar6 & 0x20) == 0) {
LAB_001f519a:
            dVar19 = 0.0;
            if (pIVar15->Min <= 0.0) {
              dVar19 = pIVar15->Min;
            }
            pIVar15->Min = dVar19;
            dVar19 = pIVar10->ExtentsY[iVar4].Max;
            dVar18 = 0.0;
            if (0.0 <= dVar19) {
              dVar18 = dVar19;
            }
            pIVar10->ExtentsY[iVar4].Max = dVar18;
          }
        }
        else if ((((uVar6 & 0x20) == 0) && ((pIVar8->XAxis).Range.Min <= dVar18)) &&
                (dVar18 <= (pIVar8->XAxis).Range.Max)) goto LAB_001f519a;
        dVar17 = dVar17 + 1.0;
        iVar13 = iVar13 + 1;
      } while (iVar12 != iVar13);
    }
    this = GetPlotDrawList();
    col = ImGui::GetColorU32((pIVar10->NextItemData).Colors);
    col_00 = ImGui::GetColorU32((pIVar10->NextItemData).Colors + 1);
    iVar12 = getter->Count;
    if (0 < iVar12) {
      bVar11 = (pIVar10->NextItemData).RenderFill;
      bVar2 = (pIVar10->NextItemData).RenderLine;
      iVar14 = 0;
      do {
        lVar9 = *(long *)((long)getter->Ys +
                         (long)(((getter->Offset + iVar14) % iVar12 + iVar12) % iVar12) *
                         (long)getter->Stride);
        if (lVar9 != 0) {
          dVar16 = (double)iVar14 + getter->XShift;
          local_38 = PlotToPixels(dVar16 - dVar22,(double)lVar9,-1);
          local_40 = PlotToPixels(dVar16 + dVar22,0.0,-1);
          if ((pIVar10->NextItemData).RenderFill == true) {
            ImDrawList::AddRectFilled(this,&local_38,&local_40,col_00,0.0,0);
          }
          if (((bVar11 ^ 1U | col != col_00) & bVar2) != 0) {
            ImDrawList::AddRect(this,&local_38,&local_40,col,0.0,0xf0,
                                (pIVar10->NextItemData).LineWeight);
          }
        }
        iVar14 = iVar14 + 1;
        iVar12 = getter->Count;
      } while (iVar14 < iVar12);
    }
    pIVar10 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar10->NextItemData);
    pIVar10->PreviousItem = pIVar10->CurrentItem;
    pIVar10->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

void PlotBarsEx(const char* label_id, const Getter& getter, double width) {
    if (BeginItem(label_id, ImPlotCol_Fill)) {
        const double half_width = width / 2;
        if (FitThisFrame()) {
            for (int i = 0; i < getter.Count; ++i) {
                ImPlotPoint p = getter(i);
                FitPoint(ImPlotPoint(p.x - half_width, p.y));
                FitPoint(ImPlotPoint(p.x + half_width, 0));
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        ImU32 col_line  = ImGui::GetColorU32(s.Colors[ImPlotCol_Line]);
        ImU32 col_fill  = ImGui::GetColorU32(s.Colors[ImPlotCol_Fill]);
        bool  rend_line = s.RenderLine;
        if (s.RenderFill && col_line == col_fill)
            rend_line = false;
        for (int i = 0; i < getter.Count; ++i) {
            ImPlotPoint p = getter(i);
            if (p.y == 0)
                continue;
            ImVec2 a = PlotToPixels(p.x - half_width, p.y);
            ImVec2 b = PlotToPixels(p.x + half_width, 0);
            if (s.RenderFill)
                DrawList.AddRectFilled(a, b, col_fill);
            if (rend_line)
                DrawList.AddRect(a, b, col_line, 0, ImDrawFlags_RoundCornersAll, s.LineWeight);
        }
        EndItem();
    }
}